

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
toml::detail::location<std::vector<char,_std::allocator<char>_>_>::~location
          (location<std::vector<char,_std::allocator<char>_>_> *this)

{
  ~location(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~location() = default;